

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

void Part_ManRecycle(Part_Man_t *p,char *pMemory,int nSize)

{
  int i;
  char *pNext;
  int Type;
  int nSize_local;
  char *pMemory_local;
  Part_Man_t *p_local;
  
  i = Part_SizeType(nSize,p->nStepSize);
  Vec_PtrFillExtra(p->vFree,i + 1,(void *)0x0);
  pNext = (char *)Vec_PtrEntry(p->vFree,i);
  Part_OneSetNext(pMemory,pNext);
  Vec_PtrWriteEntry(p->vFree,i,pMemory);
  return;
}

Assistant:

void Part_ManRecycle( Part_Man_t * p, char * pMemory, int nSize )
{
    int Type;
    Type = Part_SizeType( nSize, p->nStepSize );
    Vec_PtrFillExtra( p->vFree, Type + 1, NULL );
    Part_OneSetNext( pMemory, (char *)Vec_PtrEntry(p->vFree, Type) );
    Vec_PtrWriteEntry( p->vFree, Type, pMemory );
}